

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_filename_formatter<spdlog::details::null_scoped_padder>::format
          (source_filename_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  memory_buf_t *in_RCX;
  long in_RSI;
  char *in_RDI;
  null_scoped_padder p;
  size_t text_size;
  null_scoped_padder p_1;
  size_t local_58;
  basic_string_view<char> *in_stack_ffffffffffffffb8;
  memory_buf_t *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  null_scoped_padder local_21;
  memory_buf_t *local_20;
  
  local_20 = in_RCX;
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    null_scoped_padder::null_scoped_padder(&local_21,0,(padding_info *)(in_RDI + 8),local_20);
  }
  else {
    bVar1 = padding_info::enabled((padding_info *)(in_RDI + 8));
    if (bVar1) {
      local_58 = CLI::std::char_traits<char>::length((char_type *)0x2f76b6);
    }
    else {
      local_58 = 0;
    }
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)&stack0xffffffffffffffcf,local_58,(padding_info *)(in_RDI + 8),
               local_20);
    ::fmt::v11::basic_string_view<char>::basic_string_view(in_stack_ffffffffffffffb8,in_RDI);
    view.size_ = local_58;
    view.data_ = in_stack_ffffffffffffffc8;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        size_t text_size =
            padinfo_.enabled() ? std::char_traits<char>::length(msg.source.filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
    }